

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O0

string * __thiscall CScriptWitness::ToString_abi_cxx11_(CScriptWitness *this)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  char *in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  uint i;
  string ret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  allocator<char> *__rhs;
  uint uVar3;
  undefined4 in_stack_ffffffffffffff84;
  allocator<char> *in_stack_ffffffffffffff88;
  string *this_01;
  allocator<char> local_49 [25];
  Span<const_unsigned_char> in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __rhs = local_49;
  this_01 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,in_RSI,in_stack_ffffffffffffff88);
  std::allocator<char>::~allocator(local_49);
  uVar3 = 0;
  while( true ) {
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)uVar3;
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::size((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     *)in_stack_ffffffffffffff48);
    if (pbVar2 <= this_00) break;
    if (uVar3 != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (this_00,(char *)in_stack_ffffffffffffff50);
    }
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)this_00,(size_type)in_stack_ffffffffffffff50);
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<const_unsigned_char> *)this_00,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff50,
               in_stack_ffffffffffffff48);
    HexStr_abi_cxx11_(in_stack_ffffffffffffffd0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (this_00,in_stack_ffffffffffffff50);
    std::__cxx11::string::~string(in_stack_ffffffffffffff48);
    uVar3 = uVar3 + 1;
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff84,uVar3),(char *)__rhs);
  std::__cxx11::string::~string(in_stack_ffffffffffffff48);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string CScriptWitness::ToString() const
{
    std::string ret = "CScriptWitness(";
    for (unsigned int i = 0; i < stack.size(); i++) {
        if (i) {
            ret += ", ";
        }
        ret += HexStr(stack[i]);
    }
    return ret + ")";
}